

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

void __thiscall
Js::ScriptContextPolymorphicInlineCache::PrintStats
          (ScriptContextPolymorphicInlineCache *this,InlineCacheData *data)

{
  uint uVar1;
  uint uVar2;
  uint16 uVar3;
  uint uVar4;
  float fVar5;
  char16_t *local_30;
  uint total;
  InlineCacheData *data_local;
  ScriptContextPolymorphicInlineCache *this_local;
  
  uVar4 = data->hits + data->misses;
  if ((data->isGetCache & 1U) == 0) {
    local_30 = L"set";
  }
  else {
    local_30 = L"get";
  }
  uVar1 = data->misses;
  uVar2 = data->collisions;
  fVar5 = (float)uVar4;
  uVar3 = PolymorphicInlineCache::GetSize(&this->super_PolymorphicInlineCache);
  Output::Print(L"ScriptContext,%s,%s,%d,%d,%f,%d,%f,%d\n",(double)((float)uVar1 / fVar5),
                (double)((float)uVar2 / fVar5),local_30,(ulong)uVar4,(ulong)uVar1,(ulong)uVar2,
                (ulong)uVar3);
  return;
}

Assistant:

void ScriptContextPolymorphicInlineCache::PrintStats(InlineCacheData *data) const
    {
        uint total = data->hits + data->misses;

        Output::Print(_u("ScriptContext,%s,%s,%d,%d,%f,%d,%f,%d\n"),
            data->isGetCache ? _u("get") : _u("set"),
            total,
            data->misses,
            static_cast<float>(data->misses) / total,
            data->collisions,
            static_cast<float>(data->collisions) / total,
            GetSize()
        );
    }